

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLexer.cpp
# Opt level: O2

shared_ptr<LToken> __thiscall LLexer::next_token(LLexer *this)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  string *in_RSI;
  shared_ptr<LToken> sVar5;
  string asStack_258 [128];
  string asStack_1d8 [32];
  stringstream ss;
  ostream aoStack_1a8 [376];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  cVar1 = (**(code **)((in_RSI->_M_dataplus)._M_p + 0x10))();
  if (cVar1 == '\0') {
    _ss = 9;
    sVar5 = std::make_shared<LToken,LNodeType,char_const(&)[1]>((LNodeType *)this,(char (*) [1])&ss)
    ;
    _Var4 = sVar5.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
LAB_00111575:
    sVar5.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
    sVar5.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<LToken>)sVar5.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
LAB_001113cd:
  uVar3 = (**(code **)((in_RSI->_M_dataplus)._M_p + 0x10))();
  bVar2 = (byte)uVar3;
  if ((((bVar2 < 0x21) && ((0x100002201U >> (uVar3 & 0x3f) & 1) != 0)) ||
      (0xf5 < (byte)(bVar2 - 0x3a))) || ((bVar2 == 0x5f || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)))))
  {
LAB_001114a1:
    if ((0x20 < bVar2) || ((0x100002201U >> (uVar3 & 0x3f) & 1) == 0)) goto LAB_001114ab;
  }
  else {
    if (0x3e < bVar2) {
LAB_0011145a:
      if ((int)(uVar3 & 0xff) != 0x7e) goto LAB_001114a1;
      goto LAB_001115d5;
    }
    if ((uVar3 & 0xff) != 0x2d) {
      if ((0x1b0000000400U >> (uVar3 & 0x3f) & 1) != 0) {
        std::operator<<(aoStack_1a8,bVar2);
        std::__cxx11::stringbuf::str();
        from_symbol(this,in_RSI);
        std::__cxx11::string::~string(asStack_258);
        (**(code **)((in_RSI->_M_dataplus)._M_p + 0x18))();
        goto LAB_00111568;
      }
      if ((0x7000000000000000U >> (uVar3 & 0x3f) & 1) == 0) goto LAB_0011145a;
LAB_001115d5:
      std::operator<<(aoStack_1a8,bVar2);
      (**(code **)((in_RSI->_M_dataplus)._M_p + 0x18))();
      cVar1 = (**(code **)((in_RSI->_M_dataplus)._M_p + 0x10))();
      if (cVar1 == '=') {
        std::operator<<(aoStack_1a8,bVar2);
        (**(code **)((in_RSI->_M_dataplus)._M_p + 0x18))();
      }
      std::__cxx11::stringbuf::str();
      from_symbol(this,in_RSI);
      std::__cxx11::string::~string(asStack_1d8);
LAB_00111568:
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      _Var4._M_pi = extraout_RDX;
      goto LAB_00111575;
    }
LAB_001114ab:
    std::operator<<(aoStack_1a8,bVar2);
  }
  (**(code **)((in_RSI->_M_dataplus)._M_p + 0x18))();
  goto LAB_001113cd;
}

Assistant:

std::shared_ptr<LToken> LLexer::next_token() {
    if (this->peek() == 0) return std::make_shared<LToken>(LNodeType::EOFF, "");
    int state = 0;
    std::stringstream ss;
    while (true) {
        char c = this->peek();
        switch (state) {
            case 0:
                if (is_blank(c)) {
                    state = 0;
                } else if (is_num(c)) {
                    state = 1;
                } else if (is_word_char(c)) {
                    state = 2;
                } else if (is_minus(c)) {
                    state = 3;
                } else if (is_single_symbol(c)) {
                    ss << c;
                    auto token = this->from_symbol(ss.str());
                    this->move();
                    return token;
                } else if (is_double_symbol(c)) {
                    ss << c;
                    this->move();
                    if (this->peek() == '=') {
                        ss << c;
                        this->move();
                    }
                    return this->from_symbol(ss.str());
                }
                break;
            case 1:
                if (!is_num(c)) {
                    return this->from_int(ss.str());
                }
                break;
            case 2:
                if (!(is_word_char(c) || is_num(c))) {
                    return this->from_string(ss.str());
                }
                break;
            case 3:
                if (is_num(3)) {
                    state = 1;
                } else {
                    return this->from_symbol(ss.str());
                }
                break;
            default:
                return nullptr;
        }
        if (!is_blank(c)) ss << c;
        this->move();
    }
}